

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_cache_test.cc
# Opt level: O2

void TemplateCacheUnittest::TestTemplateCache(void)

{
  long lVar1;
  long lVar2;
  Strip SVar3;
  pointer local_a8;
  size_type sStack_a0;
  undefined1 local_98;
  undefined8 local_90;
  TemplateCache cache1;
  string filename_a;
  string filename_b;
  
  std::__cxx11::string::string((string *)&cache1,"Test template 1",(allocator *)&filename_b);
  ctemplate::StringToTemplateFile(&filename_a,(string *)&cache1);
  std::__cxx11::string::~string((string *)&cache1);
  std::__cxx11::string::string((string *)&cache1,"Test template 2.",(allocator *)&local_a8);
  ctemplate::StringToTemplateFile(&filename_b,(string *)&cache1);
  std::__cxx11::string::~string((string *)&cache1);
  ctemplate::TemplateCache::TemplateCache(&cache1);
  local_a8 = filename_a._M_dataplus._M_p;
  sStack_a0 = filename_a._M_string_length;
  local_98 = 0;
  local_90 = 0;
  SVar3 = (Strip)&local_a8;
  lVar1 = ctemplate::TemplateCache::GetTemplate((TemplateString *)&cache1,SVar3);
  if (lVar1 == 0) {
    printf("ASSERT FAILED, line %d: %s\n",0x17d,"tpl = cache1.GetTemplate(filename_a, DO_NOT_STRIP)"
          );
    local_a8 = filename_a._M_dataplus._M_p;
    sStack_a0 = filename_a._M_string_length;
    local_98 = 0;
    local_90 = 0;
    lVar1 = ctemplate::TemplateCache::GetTemplate((TemplateString *)&cache1,SVar3);
    if (lVar1 == 0) {
      __assert_fail("tpl = cache1.GetTemplate(filename_a, DO_NOT_STRIP)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                    ,0x17d,"static void TemplateCacheUnittest::TestTemplateCache()");
    }
  }
  else {
    local_a8 = filename_b._M_dataplus._M_p;
    sStack_a0 = filename_b._M_string_length;
    local_98 = 0;
    local_90 = 0;
    lVar2 = ctemplate::TemplateCache::GetTemplate((TemplateString *)&cache1,SVar3);
    if (lVar2 == 0) {
      printf("ASSERT FAILED, line %d: %s\n",0x17f,
             "tpl2 = cache1.GetTemplate(filename_b, DO_NOT_STRIP)");
      local_a8 = filename_b._M_dataplus._M_p;
      sStack_a0 = filename_b._M_string_length;
      local_98 = 0;
      local_90 = 0;
      lVar1 = ctemplate::TemplateCache::GetTemplate((TemplateString *)&cache1,SVar3);
      if (lVar1 == 0) {
        __assert_fail("tpl2 = cache1.GetTemplate(filename_b, DO_NOT_STRIP)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                      ,0x17f,"static void TemplateCacheUnittest::TestTemplateCache()");
      }
    }
    else {
      if (lVar2 == lVar1) {
        printf("ASSERT FAILED, line %d: %s\n",0x180,"tpl2 != tpl");
        __assert_fail("tpl2 != tpl",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                      ,0x180,"static void TemplateCacheUnittest::TestTemplateCache()");
      }
      local_a8 = filename_a._M_dataplus._M_p;
      sStack_a0 = filename_a._M_string_length;
      local_98 = 0;
      local_90 = 0;
      lVar2 = ctemplate::TemplateCache::GetTemplate((TemplateString *)&cache1,SVar3);
      if (lVar2 == 0) {
        printf("ASSERT FAILED, line %d: %s\n",0x181,
               "tpl2 = cache1.GetTemplate(filename_a, STRIP_BLANK_LINES)");
        local_a8 = filename_a._M_dataplus._M_p;
        sStack_a0 = filename_a._M_string_length;
        local_98 = 0;
        local_90 = 0;
        lVar1 = ctemplate::TemplateCache::GetTemplate((TemplateString *)&cache1,SVar3);
        if (lVar1 == 0) {
          __assert_fail("tpl2 = cache1.GetTemplate(filename_a, STRIP_BLANK_LINES)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                        ,0x181,"static void TemplateCacheUnittest::TestTemplateCache()");
        }
      }
      else {
        if (lVar2 == lVar1) {
          printf("ASSERT FAILED, line %d: %s\n",0x182,"tpl2 != tpl");
          __assert_fail("tpl2 != tpl",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                        ,0x182,"static void TemplateCacheUnittest::TestTemplateCache()");
        }
        local_a8 = filename_b._M_dataplus._M_p;
        sStack_a0 = filename_b._M_string_length;
        local_98 = 0;
        local_90 = 0;
        lVar2 = ctemplate::TemplateCache::GetTemplate((TemplateString *)&cache1,SVar3);
        if (lVar2 == 0) {
          printf("ASSERT FAILED, line %d: %s\n",0x183,
                 "tpl2 = cache1.GetTemplate(filename_b, STRIP_BLANK_LINES)");
          local_a8 = filename_b._M_dataplus._M_p;
          sStack_a0 = filename_b._M_string_length;
          local_98 = 0;
          local_90 = 0;
          lVar1 = ctemplate::TemplateCache::GetTemplate((TemplateString *)&cache1,SVar3);
          if (lVar1 == 0) {
            __assert_fail("tpl2 = cache1.GetTemplate(filename_b, STRIP_BLANK_LINES)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                          ,0x183,"static void TemplateCacheUnittest::TestTemplateCache()");
          }
        }
        else {
          if (lVar2 == lVar1) {
            printf("ASSERT FAILED, line %d: %s\n",0x184,"tpl2 != tpl");
            __assert_fail("tpl2 != tpl",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                          ,0x184,"static void TemplateCacheUnittest::TestTemplateCache()");
          }
          local_a8 = filename_a._M_dataplus._M_p;
          sStack_a0 = filename_a._M_string_length;
          local_98 = 0;
          local_90 = 0;
          lVar2 = ctemplate::TemplateCache::GetTemplate((TemplateString *)&cache1,SVar3);
          if (lVar2 != 0) {
            if (lVar2 == lVar1) {
              ctemplate::TemplateCache::~TemplateCache(&cache1);
              std::__cxx11::string::~string((string *)&filename_b);
              std::__cxx11::string::~string((string *)&filename_a);
              return;
            }
            printf("ASSERT FAILED, line %d: %s\n",0x186,"tpl2 == tpl");
            __assert_fail("tpl2 == tpl",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                          ,0x186,"static void TemplateCacheUnittest::TestTemplateCache()");
          }
          printf("ASSERT FAILED, line %d: %s\n",0x185,
                 "tpl2 = cache1.GetTemplate(filename_a, DO_NOT_STRIP)");
          local_a8 = filename_a._M_dataplus._M_p;
          sStack_a0 = filename_a._M_string_length;
          local_98 = 0;
          local_90 = 0;
          lVar1 = ctemplate::TemplateCache::GetTemplate((TemplateString *)&cache1,SVar3);
          if (lVar1 == 0) {
            __assert_fail("tpl2 = cache1.GetTemplate(filename_a, DO_NOT_STRIP)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                          ,0x185,"static void TemplateCacheUnittest::TestTemplateCache()");
          }
        }
      }
    }
  }
  exit(1);
}

Assistant:

static void TestTemplateCache() {
    const string filename_a = StringToTemplateFile("Test template 1");
    const string filename_b = StringToTemplateFile("Test template 2.");

    TemplateCache cache1;
    const Template *tpl, *tpl2;
    ASSERT(tpl = cache1.GetTemplate(filename_a, DO_NOT_STRIP));

    ASSERT(tpl2 = cache1.GetTemplate(filename_b, DO_NOT_STRIP));
    ASSERT(tpl2 != tpl);  // different filenames.
    ASSERT(tpl2 = cache1.GetTemplate(filename_a, STRIP_BLANK_LINES));
    ASSERT(tpl2 != tpl);  // different strip.
    ASSERT(tpl2 = cache1.GetTemplate(filename_b, STRIP_BLANK_LINES));
    ASSERT(tpl2 != tpl);  // different filenames and strip.
    ASSERT(tpl2 = cache1.GetTemplate(filename_a, DO_NOT_STRIP));
    ASSERT(tpl2 == tpl);  // same filename and strip.
  }